

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O2

int Map_LibraryReadTree(Map_SuperLib_t *pLib,Mio_Library_t *pGenlib,char *pFileName,
                       char *pExcludeFile)

{
  uint uVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  Vec_Str_t *p;
  Abc_Frame_t *p_00;
  st__table *tExcludeGate;
  FILE *__stream;
  
  if (pLib->pGenlib != (Mio_Library_t *)0x0) {
    __assert_fail("pLib->pGenlib == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                  ,0x216,
                  "int Map_LibraryReadTree(Map_SuperLib_t *, Mio_Library_t *, char *, char *)");
  }
  __s = Mio_ReadFile(pFileName,0);
  if (__s == (char *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    sVar3 = strlen(__s);
    p = (Vec_Str_t *)malloc(0x10);
    p->nSize = (int)sVar3;
    p->nCap = (int)sVar3;
    p->pArray = __s;
    if (pExcludeFile == (char *)0x0) {
      tExcludeGate = (st__table *)0x0;
    }
    else {
      p_00 = Abc_FrameGetGlobalFrame();
      tExcludeGate = st__init_table(strcmp,st__strhash);
      uVar1 = Mio_LibraryReadExclude(pExcludeFile,tExcludeGate);
      if (uVar1 == 0xffffffff) {
        st__free_table(tExcludeGate);
        Vec_StrFree(p);
        return 0;
      }
      __stream = (FILE *)Abc_FrameReadOut(p_00);
      fprintf(__stream,"Read %d gates from exclude file\n",(ulong)uVar1);
    }
    iVar2 = Map_LibraryReadFileTreeStr(pLib,pGenlib,p,pFileName);
    Vec_StrFree(p);
    if (iVar2 != 0) {
      iVar2 = Map_LibraryDeriveGateInfo(pLib,tExcludeGate);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int Map_LibraryReadTree( Map_SuperLib_t * pLib, Mio_Library_t * pGenlib, char * pFileName, char * pExcludeFile )
{
    char * pBuffer;
    Vec_Str_t * vStr;
    int Status, num;
    Abc_Frame_t * pAbc;
    st__table * tExcludeGate = 0;

    // read the beginning of the file
    assert( pLib->pGenlib == NULL );
//    pFile = Io_FileOpen( pFileName, "open_path", "r", 1 );
    pBuffer = Mio_ReadFile( pFileName, 0 );
    if ( pBuffer == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return 0;
    }
    vStr = Vec_StrAllocArray( pBuffer, strlen(pBuffer) );

    if ( pExcludeFile )
    {
        pAbc = Abc_FrameGetGlobalFrame();
        
        tExcludeGate = st__init_table(strcmp, st__strhash);
        if ( (num = Mio_LibraryReadExclude( pExcludeFile, tExcludeGate )) == -1 )
        {
            st__free_table( tExcludeGate );
            tExcludeGate = 0;
            Vec_StrFree( vStr );
            return 0;
        }

        fprintf ( Abc_FrameReadOut( pAbc ), "Read %d gates from exclude file\n", num );
    }
    
    Status = Map_LibraryReadFileTreeStr( pLib, pGenlib, vStr, pFileName );
    Vec_StrFree( vStr );
    if ( Status == 0 )
        return 0;
    // prepare the info about the library
    return Map_LibraryDeriveGateInfo( pLib, tExcludeGate );
}